

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall vkt::memory::anon_unknown_0::CacheState::waitForIdle(CacheState *this)

{
  VkPipelineStageFlags srcStages;
  uint uVar1;
  VkAccessFlags VVar2;
  CacheState *this_local;
  
  srcStages = this->m_allowedStages;
  uVar1 = this->m_allowedAccesses;
  VVar2 = getWriteAccessFlags();
  barrier(this,srcStages,uVar1 & VVar2,this->m_allowedStages,0);
  barrier(this,this->m_allowedStages,0,this->m_allowedStages & 0xffffbfff,this->m_allowedAccesses);
  return;
}

Assistant:

void CacheState::waitForIdle (void)
{
	// Make all writes available
	barrier(m_allowedStages,
			m_allowedAccesses & getWriteAccessFlags(),
			m_allowedStages,
			0);

	// Make all writes visible on device side
	barrier(m_allowedStages,
			0,
			m_allowedStages & (~vk::VK_PIPELINE_STAGE_HOST_BIT),
			m_allowedAccesses);
}